

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestDoubleToShortest(void)

{
  undefined1 uVar1;
  char *pcVar2;
  DoubleToStringConverter dc6;
  DoubleToStringConverter dc5;
  DoubleToStringConverter dc4;
  DoubleToStringConverter dc3;
  DoubleToStringConverter dc2;
  DoubleToStringConverter dcExpWidth100;
  DoubleToStringConverter dcExpWidth0;
  DoubleToStringConverter dcExpWidth2;
  DoubleToStringConverter dc;
  int flags;
  StringBuilder builder;
  char buffer [128];
  int kBufferSize;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffa0c;
  undefined4 uVar4;
  int in_stack_fffffffffffffa14;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 uVar5;
  int in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffa24;
  undefined8 in_stack_fffffffffffffa28;
  int line;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  DoubleToStringConverter local_268;
  DoubleToStringConverter local_238;
  DoubleToStringConverter local_208;
  DoubleToStringConverter local_1d8;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  DoubleToStringConverter local_118;
  DoubleToStringConverter local_d8;
  int local_a4;
  StringBuilder local_a0 [6];
  undefined4 local_4;
  
  line = (int)((ulong)in_stack_fffffffffffffa28 >> 0x20);
  local_4 = 0x80;
  double_conversion::StringBuilder::StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             in_stack_fffffffffffffa14);
  local_a4 = 9;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0x15;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_d8,9,(char *)0x0,(char *)0x0,'e',-6,0x15,0,0,0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c606);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c6a9);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c74c);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c7ef);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c892);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c935);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82c9d8);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82ca7b);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cb1e);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cbc1);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cc64);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cd07);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cdaa);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  local_a4 = 9;
  uVar6 = 2;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 6;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_118,9,(char *)0x0,(char *)0x0,'e',-4,6,0,0,2);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82ce9f);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cf42);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82cfe5);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d088);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d12b);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d1ce);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 6;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_148,local_a4,(char *)0x0,(char *)0x0,'e',-4,6,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d2b8);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d35b);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d3fe);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d4a1);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d544);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d5e7);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  uVar6 = 100;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 6;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_178,local_a4,(char *)0x0,(char *)0x0,'e',-4,6,0,0,100);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d6d1);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d774);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d817);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d8ba);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82d95d);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82da00);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  local_a4 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 1;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_1a8,0,(char *)0x0,(char *)0x0,'e',-1,1,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82daf5);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82db98);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82dc3b);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82dcde);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82dd81);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  local_a4 = 6;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 5;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_1d8,6,(char *)0x0,(char *)0x0,'E',-5,5,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82de76);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82df19);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82dfbc);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e05f);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  local_a4 = 1;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0x15;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_208,1,(char *)0x0,(char *)0x0,'e',-6,0x15,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e154);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e1f7);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e29a);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e33d);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e3e0);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_238,local_a4,(char *)0x0,(char *)0x0,'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e4d7);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar5),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e551);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar5),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e5c0);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar5),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e63a);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar5),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  double_conversion::DoubleToStringConverter::DoubleToStringConverter
            (&local_268,local_a4,"Infinity","NaN",'e',0,0,0,0,0);
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e6ee);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::Infinity();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e79b);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  double_conversion::DoubleToStringConverter::ToShortest
            ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
             (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e83d);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  double_conversion::StringBuilder::Finalize
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),line,
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::Reset(local_a0);
  double_conversion::Double::NaN();
  uVar1 = double_conversion::DoubleToStringConverter::ToShortest
                    ((DoubleToStringConverter *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                     (double)CONCAT44(in_stack_fffffffffffffa0c,uVar3),(StringBuilder *)0x82e8ea);
  CheckHelper((char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),in_stack_fffffffffffffa1c,
              (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
              SUB41((uint)in_stack_fffffffffffffa0c >> 0x18,0));
  pcVar2 = double_conversion::StringBuilder::Finalize
                     ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  CheckEqualsHelper((char *)CONCAT17(uVar1,in_stack_fffffffffffffa30),(int)((ulong)pcVar2 >> 0x20),
                    (char *)CONCAT44(in_stack_fffffffffffffa24,uVar6),
                    (char *)CONCAT44(in_stack_fffffffffffffa1c,uVar5),
                    (char *)CONCAT44(in_stack_fffffffffffffa14,uVar4),
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,uVar3));
  double_conversion::StringBuilder::~StringBuilder
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffa14,uVar4));
  return;
}

Assistant:

TEST(DoubleToShortest) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  CHECK(dc.ToShortest(0.0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(12345.0, &builder));
  CHECK_EQ("12345", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(12345e23, &builder));
  CHECK_EQ("1.2345e+27", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e21, &builder));
  CHECK_EQ("1e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e-23, &builder));
  CHECK_EQ("1e-23", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e20, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(111111111111111111111.0, &builder));
  CHECK_EQ("111111111111111110000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(11111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+22", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.00001, &builder));
  CHECK_EQ("-0.00001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.000001, &builder));
  CHECK_EQ("-0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.0000001, &builder));
  CHECK_EQ("-1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.0, &builder));
  CHECK_EQ("0", builder.Finalize());

  // Test min_exponent_width
  flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dcExpWidth2(flags, NULL, NULL, 'e', -4, 6, 0, 0, 2);

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+09", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+06", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+09", builder.Finalize());

  DoubleToStringConverter dcExpWidth0(flags, NULL, NULL, 'e', -4, 6, 0, 0, 0);

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+9", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+6", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+9", builder.Finalize());

  // Set min_exponent_width to 100 is equal to 5,
  // as kMaxExponentLength is defined to 5 in double-to-string.cc
  DoubleToStringConverter dcExpWidth100(flags, NULL, NULL, 'e', -4, 6, 0, 0, 100);

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+00010", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+00009", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+00006", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+00010", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+00009", builder.Finalize());
  // End of min_exponent_width testing

  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, NULL, NULL, 'e', -1, 1, 0, 0);
  builder.Reset();
  CHECK(dc2.ToShortest(0.1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(0.01, &builder));
  CHECK_EQ("1e-2", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(1.0, &builder));
  CHECK_EQ("1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(10.0, &builder));
  CHECK_EQ("1e1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(-0.0, &builder));
  CHECK_EQ("-0", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc3(flags, NULL, NULL, 'E', -5, 5, 0, 0);

  builder.Reset();
  CHECK(dc3.ToShortest(0.1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(1.0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(10000.0, &builder));
  CHECK_EQ("10000.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(100000.0, &builder));
  CHECK_EQ("1E5", builder.Finalize());

  // Test the examples in the comments of ToShortest.
  flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc4(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  builder.Reset();
  CHECK(dc4.ToShortest(0.000001, &builder));
  CHECK_EQ("0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(0.0000001, &builder));
  CHECK_EQ("1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(111111111111111111111.0, &builder));
  CHECK_EQ("111111111111111110000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(100000000000000000000.0, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(1111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+21", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc5.ToShortest(Double::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(-Double::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(Double::NaN(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(-Double::NaN(), &builder));

  DoubleToStringConverter dc6(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToShortest(Double::Infinity(), &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(-Double::Infinity(), &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(Double::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(-Double::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());
}